

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O0

I32 __thiscall IntegerCompressor::readCorrector(IntegerCompressor *this,ArithmeticModel *mBits)

{
  U32 UVar1;
  U32 UVar2;
  U32 UVar3;
  int c1;
  int k1;
  I32 c;
  ArithmeticModel *mBits_local;
  IntegerCompressor *this_local;
  
  UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,mBits);
  this->k = UVar1;
  if (this->k == 0) {
    c1 = ArithmeticDecoder::decodeBit(this->dec,(ArithmeticBitModel *)*this->mCorrector);
  }
  else if (this->k < 0x20) {
    if (this->bits_high < this->k) {
      UVar1 = this->k - this->bits_high;
      UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->mCorrector[this->k]);
      UVar3 = ArithmeticDecoder::readBits(this->dec,UVar1);
      c1 = UVar2 << ((byte)UVar1 & 0x1f) | UVar3;
    }
    else {
      c1 = ArithmeticDecoder::decodeSymbol(this->dec,this->mCorrector[this->k]);
    }
    if (c1 < 1 << ((char)this->k - 1U & 0x1f)) {
      c1 = c1 - ((1 << ((byte)this->k & 0x1f)) + -1);
    }
    else {
      c1 = c1 + 1;
    }
  }
  else {
    c1 = this->corr_min;
  }
  return c1;
}

Assistant:

I32 IntegerCompressor::readCorrector(ArithmeticModel* mBits)
{
  I32 c;

  // decode within which interval the corrector is falling

  k = dec->decodeSymbol(mBits);

  // decode the exact location of the corrector within the interval

#ifdef COMPRESS_ONLY_K
  if (k) // then c is either smaller than 0 or bigger than 1
  {
    if (k < 32)
    {
      c = dec->readBits(k);

      if (c >= (1<<(k-1))) // if c is in the interval [ 2^(k-1)  ...  + 2^k - 1 ]
      {
        // so we translate c back into the interval [ 2^(k-1) + 1  ...  2^k ] by adding 1 
        c += 1;
      }
      else // otherwise c is in the interval [ 0 ...  + 2^(k-1) - 1 ]
      {
        // so we translate c back into the interval [ - (2^k - 1)  ...  - (2^(k-1)) ] by subtracting (2^k - 1)
        c -= ((1<<k) - 1);
      }
    }
    else
    {
      c = corr_min;
    }
  }
  else // then c is either 0 or 1
  {
    c = dec->readBit();
  }
#else // COMPRESS_ONLY_K
  if (k) // then c is either smaller than 0 or bigger than 1
  {
    if (k < 32)
    {
      if (k <= bits_high) // for small k we can do this in one step
      {
        // decompress c with the range coder
        c = dec->decodeSymbol(mCorrector[k]);
      }
      else
      {
        // for larger k we need to do this in two steps
        int k1 = k-bits_high;
        // decompress higher bits with table
        c = dec->decodeSymbol(mCorrector[k]);
        // read lower bits raw
        int c1 = dec->readBits(k1);
        // put the corrector back together
        c = (c << k1) | c1;
      }
      // translate c back into its correct interval
      if (c >= (1<<(k-1))) // if c is in the interval [ 2^(k-1)  ...  + 2^k - 1 ]
      {
        // so we translate c back into the interval [ 2^(k-1) + 1  ...  2^k ] by adding 1 
        c += 1;
      }
      else // otherwise c is in the interval [ 0 ...  + 2^(k-1) - 1 ]
      {
        // so we translate c back into the interval [ - (2^k - 1)  ...  - (2^(k-1)) ] by subtracting (2^k - 1)
        c -= ((1<<k) - 1);
      }
    }
    else
    {
      c = corr_min;
    }
  }
  else // then c is either 0 or 1
  {
    c = dec->decodeBit((ArithmeticBitModel*)mCorrector[0]);
  }
#endif // COMPRESS_ONLY_K

  return c;
}